

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# te.hpp
# Opt level: O0

void __thiscall
te::v1::poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable>::poly<Circle,0ul>
          (poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable> *this,Circle *t)

{
  Circle *t_local;
  poly<Drawable,_te::v1::dynamic_storage,_te::v1::dynamic_vtable> *this_local;
  
  dynamic_vtable::dynamic_vtable((dynamic_vtable *)this,1);
  dynamic_storage::dynamic_storage<Circle>((dynamic_storage *)(this + 8),t);
  init<1ul,Circle,Drawable::draw(std::ostream&)const::_lambda(auto:1_const&,auto:2&)_1_,std::ostream&>
            (this);
  return;
}

Assistant:

constexpr poly(T &&t, std::index_sequence<Ns...>)
      : vtable{sizeof...(Ns)}, storage{std::forward<T>(t)} {
    static_assert(sizeof...(Ns) > 0);
    (init<Ns + 1, T>(decltype(get(detail::mappings<I, Ns + 1>{})){}), ...);
  }